

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusionRTQF.cpp
# Opt level: O0

void __thiscall RTFusionRTQF::reset(RTFusionRTQF *this)

{
  RTVector3 local_4c;
  RTVector3 local_40;
  RTVector3 local_34;
  RTVector3 local_28;
  RTVector3 local_1c;
  RTFusionRTQF *local_10;
  RTFusionRTQF *this_local;
  
  (this->super_RTFusion).m_firstTime = true;
  local_10 = this;
  RTVector3::RTVector3(&local_1c);
  RTVector3::operator=(&(this->super_RTFusion).m_fusionPose,&local_1c);
  RTQuaternion::fromEuler
            (&(this->super_RTFusion).m_fusionQPose,&(this->super_RTFusion).m_fusionPose);
  RTVector3::RTVector3(&local_28);
  RTVector3::operator=(&this->m_gyro,&local_28);
  RTVector3::RTVector3(&local_34);
  RTVector3::operator=(&(this->super_RTFusion).m_accel,&local_34);
  RTVector3::RTVector3(&local_40);
  RTVector3::operator=(&(this->super_RTFusion).m_compass,&local_40);
  RTVector3::RTVector3(&local_4c);
  RTVector3::operator=(&(this->super_RTFusion).m_measuredPose,&local_4c);
  RTQuaternion::fromEuler
            (&(this->super_RTFusion).m_measuredQPose,&(this->super_RTFusion).m_measuredPose);
  this->m_sampleNumber = 0;
  return;
}

Assistant:

void RTFusionRTQF::reset()
{
    m_firstTime = true;
    m_fusionPose = RTVector3();
    m_fusionQPose.fromEuler(m_fusionPose);
    m_gyro = RTVector3();
    m_accel = RTVector3();
    m_compass = RTVector3();
    m_measuredPose = RTVector3();
    m_measuredQPose.fromEuler(m_measuredPose);
    m_sampleNumber = 0;
 }